

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

bool cmsys::SystemTools::FindProgramPath
               (char *argv0,string *pathOut,string *errorMsg,char *exeName,char *buildDir,
               char *installPrefix)

{
  size_type sVar1;
  int iVar2;
  size_t sVar3;
  ostream *poVar4;
  char *__s;
  pointer pbVar5;
  bool bVar6;
  string self;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  failures;
  string intdir;
  value_type local_218;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  string *local_1d8;
  string *local_1d0;
  undefined1 local_1c8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __s = "";
  if (argv0 != (char *)0x0) {
    __s = argv0;
  }
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  local_1d8 = pathOut;
  local_1d0 = errorMsg;
  sVar3 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,__s,__s + sVar3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1f8,&local_218);
  ConvertToUnixSlashes(&local_218);
  local_1c8._0_8_ = (pointer)0x0;
  local_1c8._8_8_ = (pointer)0x0;
  local_1c8._16_8_ = (pointer)0x0;
  FindProgram((string *)&local_1a8,&local_218,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1c8,false);
  std::__cxx11::string::operator=((string *)&local_218,(string *)local_1a8._M_local_buf);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_allocated_capacity != local_198) {
    operator_delete((void *)local_1a8._M_allocated_capacity,local_198[0]._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1c8);
  if ((char *)local_218._M_string_length == (char *)0x0) {
    bVar6 = false;
  }
  else {
    iVar2 = access(local_218._M_dataplus._M_p,4);
    bVar6 = iVar2 == 0;
  }
  if ((buildDir != (char *)0x0) && (!bVar6)) {
    local_1a8._M_allocated_capacity = (size_type)local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,".","");
    sVar1 = local_218._M_string_length;
    strlen(buildDir);
    std::__cxx11::string::_M_replace((ulong)&local_218,0,(char *)sVar1,(ulong)buildDir);
    std::__cxx11::string::append((char *)&local_218);
    std::__cxx11::string::_M_append((char *)&local_218,local_1a8._M_allocated_capacity);
    std::__cxx11::string::append((char *)&local_218);
    std::__cxx11::string::append((char *)&local_218);
    std::__cxx11::string::append((char *)&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_allocated_capacity != local_198) {
      operator_delete((void *)local_1a8._M_allocated_capacity,local_198[0]._M_allocated_capacity + 1
                     );
    }
  }
  if (installPrefix != (char *)0x0) {
    if ((char *)local_218._M_string_length != (char *)0x0) {
      iVar2 = access(local_218._M_dataplus._M_p,4);
      if (iVar2 == 0) goto LAB_0010e486;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_1f8,&local_218);
    sVar1 = local_218._M_string_length;
    strlen(installPrefix);
    std::__cxx11::string::_M_replace((ulong)&local_218,0,(char *)sVar1,(ulong)installPrefix);
    std::__cxx11::string::append((char *)&local_218);
    std::__cxx11::string::append((char *)&local_218);
  }
LAB_0010e486:
  if ((char *)local_218._M_string_length != (char *)0x0) {
    iVar2 = access(local_218._M_dataplus._M_p,4);
    if (iVar2 == 0) {
      bVar6 = true;
      std::__cxx11::string::_M_assign((string *)local_1d8);
      goto LAB_0010e628;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1f8,&local_218);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8._M_local_buf);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8._M_local_buf,"Can not find the command line program ",0x26);
  if (exeName != (char *)0x0) {
    sVar3 = strlen(exeName);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8._M_local_buf,exeName,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8._M_local_buf,"\n",1);
  if (argv0 != (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8._M_local_buf,"  argv[0] = \"",0xd);
    sVar3 = strlen(argv0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8._M_local_buf,argv0,sVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8._M_local_buf,"\"\n",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8._M_local_buf,"  Attempted paths:\n",0x13);
  if (local_1f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar5 = local_1f8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8._M_local_buf,"    \"",5);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8._M_local_buf,(pbVar5->_M_dataplus)._M_p,
                          pbVar5->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"\n",2);
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != local_1f8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)local_1d0,(string *)local_1c8);
  if ((pointer)local_1c8._0_8_ != (pointer)(local_1c8 + 0x10)) {
    operator_delete((void *)local_1c8._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_1c8._16_8_)->_M_p + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8._M_local_buf);
  std::ios_base::~ios_base(local_138);
  bVar6 = false;
LAB_0010e628:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f8);
  return bVar6;
}

Assistant:

bool SystemTools::FindProgramPath(const char* argv0,
                                  kwsys_stl::string& pathOut,
                                  kwsys_stl::string& errorMsg,
                                  const char* exeName,
                                  const char* buildDir,
                                  const char* installPrefix )
{
  kwsys_stl::vector<kwsys_stl::string> failures;
  kwsys_stl::string self = argv0 ? argv0 : "";
  failures.push_back(self);
  SystemTools::ConvertToUnixSlashes(self);
  self = SystemTools::FindProgram(self);
  if(!SystemTools::FileExists(self))
    {
    if(buildDir)
      {
      kwsys_stl::string intdir = ".";
#ifdef  CMAKE_INTDIR
      intdir = CMAKE_INTDIR;
#endif
      self = buildDir;
      self += "/bin/";
      self += intdir;
      self += "/";
      self += exeName;
      self += SystemTools::GetExecutableExtension();
      }
    }
  if(installPrefix)
    {
    if(!SystemTools::FileExists(self))
      {
      failures.push_back(self);
      self = installPrefix;
      self += "/bin/";
      self +=  exeName;
      }
    }
  if(!SystemTools::FileExists(self))
    {
    failures.push_back(self);
    kwsys_ios::ostringstream msg;
    msg << "Can not find the command line program ";
    if (exeName)
      {
      msg << exeName;
      }
    msg << "\n";
    if (argv0)
      {
      msg << "  argv[0] = \"" << argv0 << "\"\n";
      }
    msg << "  Attempted paths:\n";
    kwsys_stl::vector<kwsys_stl::string>::iterator i;
    for(i=failures.begin(); i != failures.end(); ++i)
      {
      msg << "    \"" << *i << "\"\n";
      }
    errorMsg = msg.str();
    return false;
    }
  pathOut = self;
  return true;
}